

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O3

void CreateBackwardReferencesDH42
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  long lVar1;
  ulong uVar2;
  ulong *puVar3;
  long lVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  BrotliEncoderDictionary *pBVar8;
  void *pvVar9;
  void *pvVar10;
  HasherCommon *pHVar11;
  PreparedDictionary *pPVar12;
  size_t sVar13;
  BrotliDictionary *pBVar14;
  undefined8 uVar15;
  byte bVar16;
  bool bVar17;
  ulong uVar18;
  uint *puVar19;
  size_t sVar20;
  ulong uVar21;
  byte bVar22;
  uint uVar23;
  ulong uVar24;
  uint8_t *puVar25;
  ulong *puVar26;
  ulong uVar27;
  uint32_t uVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  int last_distance;
  long lVar32;
  size_t sVar33;
  ulong uVar34;
  ulong *puVar35;
  uint8_t *s1_orig_1;
  ulong uVar36;
  uint16_t uVar37;
  uint uVar38;
  ulong uVar39;
  ulong *puVar40;
  byte bVar41;
  ushort uVar42;
  ulong uVar43;
  ulong uVar44;
  undefined8 *puVar45;
  uint uVar46;
  size_t sVar47;
  long lVar48;
  ulong uVar49;
  long lVar50;
  ulong *puVar51;
  long lVar52;
  uint8_t *puVar53;
  ulong uVar54;
  ulong uVar55;
  long lVar56;
  size_t sVar57;
  uint8_t *puVar58;
  ulong uVar59;
  bool bVar60;
  uint32_t *addr_4;
  int iVar61;
  int iVar62;
  ulong local_198;
  ulong local_190;
  ulong local_180;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  size_t local_158;
  int local_144;
  ulong local_138;
  ulong local_128;
  Command *local_f8;
  ulong local_f0;
  ulong local_e8;
  uint local_d8;
  int local_d4;
  ulong local_c0;
  ulong local_b0;
  BankH42 *banks_1;
  
  iVar30 = params->lgwin;
  sVar6 = params->stream_offset;
  uVar5 = (position - 3) + num_bytes;
  sVar47 = position;
  if (3 < num_bytes) {
    sVar47 = uVar5;
  }
  lVar56 = 0x200;
  if (params->quality < 9) {
    lVar56 = 0x40;
  }
  local_158 = *last_insert_len;
  sVar7 = (params->dictionary).compound.total_size;
  iVar61 = (int)*(undefined8 *)dist_cache;
  iVar62 = (int)((ulong)*(undefined8 *)dist_cache >> 0x20);
  dist_cache[4] = iVar61 + -1;
  dist_cache[5] = iVar61 + 1;
  dist_cache[6] = iVar61 + -2;
  dist_cache[7] = iVar61 + 2;
  dist_cache[8] = iVar61 + -3;
  dist_cache[9] = iVar61 + 3;
  dist_cache[10] = iVar62 + -1;
  dist_cache[0xb] = iVar62 + 1;
  dist_cache[0xc] = iVar62 + -2;
  dist_cache[0xd] = iVar62 + 2;
  dist_cache[0xe] = iVar62 + -3;
  dist_cache[0xf] = iVar62 + 3;
  uVar2 = position + num_bytes;
  if (uVar2 <= position + 4) {
    local_f8 = commands;
LAB_01108705:
    *last_insert_len = (local_158 + uVar2) - position;
    *num_commands = *num_commands + ((long)local_f8 - (long)commands >> 4);
    return;
  }
  uVar36 = (1L << ((byte)iVar30 & 0x3f)) - 0x10;
  uVar55 = lVar56 + position;
  lVar1 = sVar7 + 1;
  lVar4 = position - 1;
  local_f8 = commands;
  uVar27 = position;
LAB_01106a31:
  uVar31 = uVar36;
  if (uVar27 < uVar36) {
    uVar31 = uVar27;
  }
  uVar21 = sVar6 + uVar27;
  if (uVar36 <= sVar6 + uVar27) {
    uVar21 = uVar36;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    local_d8 = 0;
    local_b0 = 0;
    goto LAB_01106acc;
  }
  if (uVar27 == 0) {
    local_b0 = 0;
LAB_01106a9b:
    uVar44 = 0;
  }
  else {
    local_b0 = (ulong)ringbuffer[uVar27 - 1 & ringbuffer_mask];
    if (uVar27 == 1) goto LAB_01106a9b;
    uVar44 = (ulong)ringbuffer[uVar27 - 2 & ringbuffer_mask];
  }
  local_d8 = (uint)(params->dictionary).contextual.context_map
                   [literal_context_lut[uVar44 + 0x100] | literal_context_lut[local_b0]];
LAB_01106acc:
  local_178 = uVar2 - uVar27;
  pBVar8 = (params->dictionary).contextual.dict[local_d8];
  uVar44 = (params->dist).max_distance;
  pvVar9 = (hasher->privat)._H42.extra[0];
  pvVar10 = (hasher->privat)._H42.extra[1];
  uVar18 = uVar27 & ringbuffer_mask;
  puVar3 = (ulong *)(ringbuffer + uVar18);
  uVar38 = (uint)(*(int *)(ringbuffer + uVar18) * 0x1e35a7bd) >> 0x11;
  local_170 = 0x7e4;
  uVar39 = 0;
  lVar48 = 0;
  local_160 = 0;
  local_f0 = 0;
LAB_01106b47:
  uVar43 = (ulong)dist_cache[lVar48];
  uVar24 = uVar27 - uVar43;
  if ((((lVar48 == 0) || (*(char *)((long)pvVar9 + (uVar24 & 0xffff) + 0x30000) == (char)uVar38)) &&
      (uVar43 <= uVar31)) && (uVar24 < uVar27)) {
    puVar25 = ringbuffer + (uVar24 & ringbuffer_mask);
    uVar24 = local_178;
    puVar51 = puVar3;
    puVar53 = puVar25;
    if (7 < local_178) {
      lVar50 = 0;
      lVar32 = 0;
LAB_01106ba3:
      if (*(ulong *)((long)puVar3 + lVar50) == *(ulong *)(puVar25 + lVar50)) goto code_r0x01106bb1;
      uVar59 = *(ulong *)(puVar25 + lVar50) ^ *(ulong *)((long)puVar3 + lVar50);
      uVar24 = 0;
      if (uVar59 != 0) {
        for (; (uVar59 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
        }
      }
      uVar24 = (uVar24 >> 3 & 0x1fffffff) - lVar32;
      goto LAB_01106c1d;
    }
    goto LAB_01106bdc;
  }
  goto LAB_01106c6e;
code_r0x01106bb1:
  lVar50 = lVar50 + 8;
  lVar52 = local_178 + lVar32;
  lVar32 = lVar32 + -8;
  if (lVar52 - 8U < 8) goto code_r0x01106bcb;
  goto LAB_01106ba3;
code_r0x01106bcb:
  puVar53 = puVar25 + -lVar32;
  puVar51 = (ulong *)((long)puVar3 - lVar32);
  uVar24 = lVar32 + local_178;
LAB_01106bdc:
  if (uVar24 != 0) {
    uVar59 = 0;
    do {
      uVar54 = uVar59;
      if (puVar53[uVar59] != *(uint8_t *)((long)puVar51 + uVar59)) break;
      uVar59 = uVar59 + 1;
      uVar54 = uVar24;
    } while (uVar24 != uVar59);
    puVar53 = puVar53 + uVar54;
  }
  uVar24 = (long)puVar53 - (long)puVar25;
LAB_01106c1d:
  if ((1 < uVar24) && (uVar59 = uVar24 * 0x87 + 0x78f, local_170 < uVar59)) {
    if (lVar48 != 0) {
      uVar59 = uVar59 - ((0x1ca10U >> ((byte)lVar48 & 0xe) & 0xe) + 0x27);
    }
    if (local_170 < uVar59) {
      local_f0 = uVar43;
      uVar39 = uVar24;
      local_170 = uVar59;
      local_160 = uVar24;
    }
  }
LAB_01106c6e:
  lVar48 = lVar48 + 1;
  if (lVar48 == 0x10) goto code_r0x01106c80;
  goto LAB_01106b47;
code_r0x01106c80:
  uVar43 = (ulong)uVar38;
  uVar46 = uVar38 & 0x1ff;
  sVar33 = (hasher->privat)._H42.max_hops;
  uVar24 = uVar27 - *(uint *)((long)pvVar9 + uVar43 * 4);
  if (sVar33 != 0) {
    uVar42 = *(ushort *)((long)pvVar9 + uVar43 * 2 + 0x20000);
    uVar54 = 0;
    uVar59 = uVar24;
LAB_01106cd7:
    uVar54 = uVar59 + uVar54;
    if (uVar54 <= uVar31) {
      if (uVar18 + uVar39 <= ringbuffer_mask) {
        uVar49 = uVar27 - uVar54 & ringbuffer_mask;
        uVar59 = uVar49 + uVar39;
        if ((ringbuffer_mask < uVar59) || (ringbuffer[uVar18 + uVar39] != ringbuffer[uVar59]))
        goto LAB_01106db0;
        puVar25 = ringbuffer + uVar49;
        uVar59 = local_178;
        puVar51 = puVar3;
        puVar53 = puVar25;
        if (7 < local_178) {
          lVar32 = 0;
          lVar48 = 0;
LAB_01106d49:
          if (*(ulong *)((long)puVar3 + lVar32) == *(ulong *)(puVar25 + lVar32))
          goto code_r0x01106d57;
          uVar49 = *(ulong *)(puVar25 + lVar32) ^ *(ulong *)((long)puVar3 + lVar32);
          uVar59 = 0;
          if (uVar49 != 0) {
            for (; (uVar49 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
            }
          }
          uVar59 = (uVar59 >> 3 & 0x1fffffff) - lVar48;
          goto LAB_01106de0;
        }
        goto LAB_01106d81;
      }
      goto LAB_01106db0;
    }
  }
LAB_01106e20:
  uVar42 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar46 * 2);
  *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar46 * 2) = uVar42 + 1;
  uVar23 = uVar42 & 0x1ff;
  *(char *)((long)pvVar9 + (uVar27 & 0xffff) + 0x30000) = (char)uVar38;
  if (0xfffe < uVar24) {
    uVar24 = 0xffff;
  }
  *(short *)((long)pvVar10 + (ulong)uVar23 * 4 + (ulong)(uVar46 << 0xb)) = (short)uVar24;
  *(undefined2 *)((long)pvVar10 + (ulong)uVar23 * 4 + (ulong)(uVar46 << 0xb) + 2) =
       *(undefined2 *)((long)pvVar9 + uVar43 * 2 + 0x20000);
  *(int *)((long)pvVar9 + uVar43 * 4) = (int)uVar27;
  *(short *)((long)pvVar9 + uVar43 * 2 + 0x20000) = (short)uVar23;
  local_e8 = local_160;
  if (local_170 == 0x7e4) {
    pHVar11 = (hasher->privat)._H42.common;
    uVar39 = pHVar11->dict_num_lookups;
    local_170 = pHVar11->dict_num_matches;
    if (uVar39 >> 7 <= local_170) {
      uVar24 = (ulong)((uint)((int)*puVar3 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      puVar53 = pBVar8->hash_table_lengths;
      uVar31 = 0x7e4;
      local_144 = 0;
      bVar60 = true;
LAB_01107fa6:
      uVar39 = uVar39 + 1;
      pHVar11->dict_num_lookups = uVar39;
      bVar22 = puVar53[uVar24];
      uVar43 = (ulong)bVar22;
      if ((uVar43 != 0) && (uVar43 <= local_178)) {
        pBVar14 = pBVar8->words;
        puVar26 = (ulong *)(pBVar14->data +
                           (ulong)pBVar14->offsets_by_length[uVar43] +
                           pBVar8->hash_table_words[uVar24] * uVar43);
        uVar59 = uVar43;
        puVar51 = puVar3;
        if (7 < bVar22) {
          lVar48 = 0;
LAB_01108016:
          if (*puVar26 == *puVar51) goto code_r0x01108021;
          uVar54 = *puVar51 ^ *puVar26;
          uVar59 = 0;
          if (uVar54 != 0) {
            for (; (uVar54 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
            }
          }
          uVar59 = (uVar59 >> 3 & 0x1fffffff) - lVar48;
          goto LAB_01108081;
        }
        goto LAB_01108048;
      }
      goto LAB_01107fc6;
    }
    local_144 = 0;
    uVar31 = 0x7e4;
  }
  else {
    local_144 = 0;
    uVar31 = local_170;
  }
LAB_01106ef9:
  local_160 = (params->dist).max_distance;
  sVar33 = (params->dictionary).compound.num_chunks;
  local_170 = uVar31;
  if (sVar33 != 0) {
    sVar57 = 0;
LAB_01106f3d:
    pPVar12 = (params->dictionary).compound.chunks[sVar57];
    bVar22 = (byte)pPVar12->bucket_bits;
    bVar41 = (byte)pPVar12->slot_bits;
    bVar16 = -(char)pPVar12->hash_bits;
    uVar31 = ((*puVar3 << (bVar16 & 0x3f)) >> (bVar16 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
             (-bVar22 & 0x3f);
    lVar48 = (1L << (bVar41 & 0x3f)) * 4;
    lVar32 = (1L << (bVar22 & 0x3f)) * 2;
    bVar41 = -bVar41;
    puVar45 = (undefined8 *)
              ((long)&pPVar12[1].magic + (ulong)pPVar12->num_items * 4 + lVar32 + lVar48);
    if (pPVar12->magic != 0xdebcede0) {
      puVar45 = (undefined8 *)*puVar45;
    }
    uVar44 = (uVar21 + (params->dictionary).compound.total_size) -
             (params->dictionary).compound.chunk_offsets[sVar57];
    uVar39 = (ulong)pPVar12->source_size;
    uVar42 = *(ushort *)((long)&pPVar12[1].magic + (uVar31 & 0xffffffff) * 2 + lVar48);
    puVar19 = (uint *)((long)&pPVar12[1].magic +
                      (ulong)((uint)uVar42 +
                             (&pPVar12[1].magic)
                             [(uint)((int)uVar31 << (bVar41 & 0x1f)) >> (bVar41 & 0x1f)]) * 4 +
                      lVar32 + lVar48);
    lVar48 = 0;
    uVar31 = local_e8;
LAB_01106ff7:
    uVar24 = (ulong)dist_cache[lVar48];
    if ((uVar44 - uVar39 < uVar24) && (uVar24 <= uVar44)) {
      uVar43 = uVar39 - (uVar44 - uVar24);
      if (local_178 <= uVar43) {
        uVar43 = local_178;
      }
      lVar50 = (uVar44 - uVar24) + (long)puVar45;
      lVar32 = lVar50;
      puVar51 = puVar3;
      if (7 < uVar43) {
        lVar52 = 0;
LAB_0110702f:
        if (*(ulong *)((long)puVar3 + lVar52) == *(ulong *)(lVar50 + lVar52)) goto code_r0x0110703d;
        uVar59 = *(ulong *)(lVar50 + lVar52) ^ *(ulong *)((long)puVar3 + lVar52);
        uVar43 = 0;
        if (uVar59 != 0) {
          for (; (uVar59 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
          }
        }
        uVar43 = (uVar43 >> 3 & 0x1fffffff) + lVar52;
        goto LAB_0110709a;
      }
      goto LAB_0110705a;
    }
    goto LAB_011070fa;
  }
LAB_01107288:
  if (0x7e4 < local_170) {
    uVar31 = local_158 + 4;
    local_128 = (lVar4 + num_bytes) - uVar27;
    uVar55 = sVar6 + 1 + uVar27;
    local_d4 = 0;
LAB_011072de:
    uVar21 = uVar36;
    if (uVar55 < uVar36) {
      uVar21 = uVar55;
    }
    local_178 = local_178 - 1;
    local_190 = local_e8 - 1;
    if (local_178 <= local_e8 - 1) {
      local_190 = local_178;
    }
    if (4 < params->quality) {
      local_190 = 0;
    }
    uVar44 = uVar27 + 1;
    uVar39 = uVar36;
    if (uVar44 < uVar36) {
      uVar39 = uVar44;
    }
    local_c0 = sVar6 + uVar27 + 1;
    if (uVar36 <= local_c0) {
      local_c0 = uVar36;
    }
    if ((params->dictionary).contextual.context_based != 0) {
      local_d8 = (uint)(params->dictionary).contextual.context_map
                       [literal_context_lut[local_b0 + 0x100] |
                        literal_context_lut[ringbuffer[uVar27 & ringbuffer_mask]]];
      local_b0 = (ulong)ringbuffer[uVar27 & ringbuffer_mask];
    }
    pBVar8 = (params->dictionary).contextual.dict[local_d8];
    pvVar9 = (hasher->privat)._H42.extra[0];
    pvVar10 = (hasher->privat)._H42.extra[1];
    uVar18 = uVar44 & ringbuffer_mask;
    puVar3 = (ulong *)(ringbuffer + uVar18);
    uVar38 = (uint)(*(int *)(ringbuffer + uVar18) * 0x1e35a7bd) >> 0x11;
    local_180 = 0x7e4;
    lVar48 = 0;
    local_198 = 0;
    local_168 = 0;
LAB_011073ff:
    uVar43 = (ulong)dist_cache[lVar48];
    uVar24 = uVar44 - uVar43;
    if (((lVar48 == 0) || (*(char *)((long)pvVar9 + (uVar24 & 0xffff) + 0x30000) == (char)uVar38))
       && ((uVar43 <= uVar39 && (uVar24 < uVar44)))) {
      puVar25 = ringbuffer + (uVar24 & ringbuffer_mask);
      puVar53 = puVar25;
      uVar24 = local_178;
      puVar51 = puVar3;
      if (7 < local_178) {
        lVar32 = 0;
        lVar50 = 0;
LAB_01107453:
        if (*(ulong *)((long)puVar3 + lVar32) == *(ulong *)(puVar25 + lVar32))
        goto code_r0x01107461;
        uVar59 = *(ulong *)(puVar25 + lVar32) ^ *(ulong *)((long)puVar3 + lVar32);
        uVar24 = 0;
        if (uVar59 != 0) {
          for (; (uVar59 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
          }
        }
        uVar24 = (uVar24 >> 3 & 0x1fffffff) - lVar50;
        goto LAB_011074c9;
      }
      goto LAB_0110748c;
    }
    goto LAB_0110751b;
  }
  local_158 = local_158 + 1;
  position = uVar27 + 1;
  if (uVar55 < position) {
    if ((uint)((int)lVar56 * 4) + uVar55 < position) {
      uVar31 = uVar27 + 0x11;
      if (uVar2 - 4 <= uVar27 + 0x11) {
        uVar31 = uVar2 - 4;
      }
      if (position < uVar31) {
        pvVar9 = (hasher->privat)._H42.extra[0];
        pvVar10 = (hasher->privat)._H42.extra[1];
        do {
          uVar38 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar27 = (ulong)uVar38;
          uVar23 = uVar38 & 0x1ff;
          uVar42 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar23 * 2);
          *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar23 * 2) = uVar42 + 1;
          uVar46 = uVar42 & 0x1ff;
          uVar21 = position - *(uint *)((long)pvVar9 + uVar27 * 4);
          if (0xfffe < uVar21) {
            uVar21 = 0xffff;
          }
          *(char *)((long)pvVar9 + (position & 0xffff) + 0x30000) = (char)uVar38;
          *(short *)((long)pvVar10 + (ulong)uVar46 * 4 + (ulong)(uVar23 << 0xb)) = (short)uVar21;
          *(undefined2 *)((long)pvVar10 + (ulong)uVar46 * 4 + (ulong)(uVar23 << 0xb) + 2) =
               *(undefined2 *)((long)pvVar9 + uVar27 * 2 + 0x20000);
          *(int *)((long)pvVar9 + uVar27 * 4) = (int)position;
          *(short *)((long)pvVar9 + uVar27 * 2 + 0x20000) = (short)uVar46;
          local_158 = local_158 + 4;
          position = position + 4;
        } while (position < uVar31);
      }
    }
    else {
      uVar31 = uVar27 + 9;
      if (uVar5 <= uVar27 + 9) {
        uVar31 = uVar5;
      }
      if (position < uVar31) {
        pvVar9 = (hasher->privat)._H42.extra[0];
        pvVar10 = (hasher->privat)._H42.extra[1];
        do {
          uVar38 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar27 = (ulong)uVar38;
          uVar23 = uVar38 & 0x1ff;
          uVar42 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar23 * 2);
          *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar23 * 2) = uVar42 + 1;
          uVar46 = uVar42 & 0x1ff;
          uVar21 = position - *(uint *)((long)pvVar9 + uVar27 * 4);
          if (0xfffe < uVar21) {
            uVar21 = 0xffff;
          }
          *(char *)((long)pvVar9 + (position & 0xffff) + 0x30000) = (char)uVar38;
          *(short *)((long)pvVar10 + (ulong)uVar46 * 4 + (ulong)(uVar23 << 0xb)) = (short)uVar21;
          *(undefined2 *)((long)pvVar10 + (ulong)uVar46 * 4 + (ulong)(uVar23 << 0xb) + 2) =
               *(undefined2 *)((long)pvVar9 + uVar27 * 2 + 0x20000);
          *(int *)((long)pvVar9 + uVar27 * 4) = (int)position;
          *(short *)((long)pvVar9 + uVar27 * 2 + 0x20000) = (short)uVar46;
          local_158 = local_158 + 2;
          position = position + 2;
        } while (position < uVar31);
      }
    }
  }
  goto LAB_0110869f;
code_r0x01106d57:
  lVar32 = lVar32 + 8;
  lVar50 = local_178 + lVar48;
  lVar48 = lVar48 + -8;
  if (lVar50 - 8U < 8) goto code_r0x01106d72;
  goto LAB_01106d49;
code_r0x01106d72:
  puVar53 = puVar25 + -lVar48;
  puVar51 = (ulong *)((long)puVar3 - lVar48);
  uVar59 = lVar48 + local_178;
LAB_01106d81:
  puVar58 = puVar53;
  if (uVar59 != 0) {
    puVar58 = puVar53 + uVar59;
    uVar49 = 0;
    do {
      if (puVar53[uVar49] != *(uint8_t *)((long)puVar51 + uVar49)) {
        puVar58 = puVar53 + uVar49;
        break;
      }
      uVar49 = uVar49 + 1;
    } while (uVar59 != uVar49);
  }
  uVar59 = (long)puVar58 - (long)puVar25;
LAB_01106de0:
  if (3 < uVar59) {
    iVar30 = 0x1f;
    if ((uint)uVar54 != 0) {
      for (; (uint)uVar54 >> iVar30 == 0; iVar30 = iVar30 + -1) {
      }
    }
    uVar49 = (ulong)(iVar30 * -0x1e + 0x780) + uVar59 * 0x87;
    if (local_170 < uVar49) {
      local_f0 = uVar54;
      uVar39 = uVar59;
      local_170 = uVar49;
      local_160 = uVar59;
    }
  }
LAB_01106db0:
  uVar59 = (ulong)uVar42;
  uVar42 = *(ushort *)((long)pvVar10 + uVar59 * 4 + (ulong)(uVar46 << 0xb) + 2);
  uVar59 = (ulong)*(ushort *)((long)pvVar10 + uVar59 * 4 + (ulong)(uVar46 << 0xb));
  sVar33 = sVar33 - 1;
  if (sVar33 == 0) goto LAB_01106e20;
  goto LAB_01106cd7;
code_r0x01108021:
  puVar26 = puVar26 + 1;
  puVar51 = puVar51 + 1;
  lVar32 = uVar43 + lVar48;
  lVar48 = lVar48 + -8;
  if (lVar32 - 8U < 8) goto code_r0x0110803b;
  goto LAB_01108016;
code_r0x0110803b:
  uVar59 = lVar48 + uVar43;
  if (lVar48 + uVar43 != 0) {
LAB_01108048:
    uVar54 = 0;
    do {
      uVar49 = uVar54;
      if (*(char *)((long)puVar51 + uVar54) != *(char *)((long)puVar26 + uVar54)) break;
      uVar54 = uVar54 + 1;
      uVar49 = uVar59;
    } while (uVar59 != uVar54);
    puVar51 = (ulong *)((long)puVar51 + uVar49);
  }
  uVar59 = (long)puVar51 - (long)puVar3;
LAB_01108081:
  if (((uVar59 != 0) && (uVar43 < pBVar8->cutoffTransformsCount + uVar59)) &&
     (uVar43 = (ulong)pBVar8->hash_table_words[uVar24] + lVar1 + uVar21 +
               ((ulong)((uint)(pBVar8->cutoffTransforms >>
                              ((char)(uVar43 - uVar59) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar43 - uVar59) * 4 << (pBVar14->size_bits_by_length[uVar43] & 0x3f)),
     uVar43 <= uVar44)) {
    iVar30 = 0x1f;
    if ((uint)uVar43 != 0) {
      for (; (uint)uVar43 >> iVar30 == 0; iVar30 = iVar30 + -1) {
      }
    }
    uVar54 = (uVar59 * 0x87 - (ulong)(uint)(iVar30 * 0x1e)) + 0x780;
    if (uVar31 <= uVar54) {
      local_144 = (uint)bVar22 - (int)uVar59;
      local_170 = local_170 + 1;
      pHVar11->dict_num_matches = local_170;
      local_f0 = uVar43;
      uVar31 = uVar54;
      local_160 = uVar59;
    }
  }
LAB_01107fc6:
  uVar24 = uVar24 + 1;
  bVar17 = !bVar60;
  local_e8 = local_160;
  bVar60 = false;
  if (bVar17) goto LAB_01106ef9;
  goto LAB_01107fa6;
code_r0x0110703d:
  uVar43 = uVar43 - 8;
  lVar52 = lVar52 + 8;
  if (uVar43 < 8) goto code_r0x0110704b;
  goto LAB_0110702f;
code_r0x0110704b:
  lVar32 = lVar50 + lVar52;
  puVar51 = (ulong *)(lVar52 + (long)puVar3);
LAB_0110705a:
  if (uVar43 != 0) {
    uVar59 = 0;
    do {
      uVar54 = uVar59;
      if (*(char *)(lVar32 + uVar59) != *(char *)((long)puVar51 + uVar59)) break;
      uVar59 = uVar59 + 1;
      uVar54 = uVar43;
    } while (uVar43 != uVar59);
    lVar32 = lVar32 + uVar54;
  }
  uVar43 = lVar32 - lVar50;
LAB_0110709a:
  if ((1 < uVar43) && (uVar59 = uVar43 * 0x87 + 0x78f, local_170 < uVar59)) {
    if (lVar48 != 0) {
      uVar59 = uVar59 - ((0x1ca10U >> ((byte)lVar48 & 2) & 4) + 0x27);
    }
    if (local_170 < uVar59) {
      if (uVar31 < uVar43) {
        uVar31 = uVar43;
      }
      local_144 = 0;
      local_170 = uVar59;
      local_f0 = uVar24;
      local_e8 = uVar43;
    }
  }
LAB_011070fa:
  lVar48 = lVar48 + 1;
  if (lVar48 == 4) goto code_r0x01107107;
  goto LAB_01106ff7;
code_r0x01107107:
  if (uVar42 != 0xffff) {
LAB_01107222:
    uVar38 = *puVar19;
    uVar59 = (ulong)(uVar38 & 0x7fffffff);
    uVar43 = uVar44 - uVar59;
    uVar24 = uVar39 - uVar59;
    if (local_178 <= uVar39 - uVar59) {
      uVar24 = local_178;
    }
    if ((((uVar43 <= local_160) && (uVar31 + uVar18 <= ringbuffer_mask)) && (uVar31 < uVar24)) &&
       (ringbuffer[uVar31 + uVar18] == *(uint8_t *)((long)puVar45 + uVar31 + uVar59))) {
      puVar35 = (ulong *)(uVar59 + (long)puVar45);
      puVar51 = puVar35;
      puVar26 = puVar3;
      if (7 < uVar24) {
        lVar48 = 0;
        puVar40 = puVar35;
LAB_01107163:
        if (*puVar26 == *puVar40) goto code_r0x0110716e;
        uVar59 = *puVar40 ^ *puVar26;
        uVar24 = 0;
        if (uVar59 != 0) {
          for (; (uVar59 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
          }
        }
        uVar24 = (uVar24 >> 3 & 0x1fffffff) - lVar48;
        goto LAB_011071d8;
      }
      goto LAB_0110719d;
    }
    goto LAB_01107256;
  }
LAB_0110725e:
  sVar57 = sVar57 + 1;
  if (sVar57 == sVar33) goto LAB_01107288;
  goto LAB_01106f3d;
code_r0x0110716e:
  puVar26 = puVar26 + 1;
  puVar40 = puVar40 + 1;
  lVar32 = uVar24 + lVar48;
  lVar48 = lVar48 + -8;
  if (lVar32 - 8U < 8) goto code_r0x01107188;
  goto LAB_01107163;
code_r0x01107188:
  uVar24 = uVar24 + lVar48;
  puVar51 = puVar40;
  if (uVar24 != 0) {
LAB_0110719d:
    puVar40 = (ulong *)((long)puVar51 + uVar24);
    uVar59 = 0;
    do {
      if (*(char *)((long)puVar51 + uVar59) != *(char *)((long)puVar26 + uVar59)) {
        puVar40 = (ulong *)((long)puVar51 + uVar59);
        break;
      }
      uVar59 = uVar59 + 1;
    } while (uVar24 != uVar59);
  }
  uVar24 = (long)puVar40 - (long)puVar35;
LAB_011071d8:
  if (3 < uVar24) {
    iVar30 = 0x1f;
    if ((uint)uVar43 != 0) {
      for (; (uint)uVar43 >> iVar30 == 0; iVar30 = iVar30 + -1) {
      }
    }
    uVar59 = (ulong)(iVar30 * -0x1e + 0x780) + uVar24 * 0x87;
    if (local_170 < uVar59) {
      local_144 = 0;
      uVar31 = uVar24;
      local_170 = uVar59;
      local_f0 = uVar43;
      local_e8 = uVar24;
    }
  }
LAB_01107256:
  puVar19 = puVar19 + 1;
  if ((int)uVar38 < 0) goto LAB_0110725e;
  goto LAB_01107222;
code_r0x01107461:
  lVar32 = lVar32 + 8;
  lVar52 = local_128 + lVar50;
  lVar50 = lVar50 + -8;
  if (lVar52 - 8U < 8) goto code_r0x0110747b;
  goto LAB_01107453;
code_r0x0110747b:
  puVar53 = puVar25 + -lVar50;
  puVar51 = (ulong *)((long)puVar3 - lVar50);
  uVar24 = lVar50 + local_128;
LAB_0110748c:
  if (uVar24 != 0) {
    uVar59 = 0;
    do {
      uVar54 = uVar59;
      if (puVar53[uVar59] != *(uint8_t *)((long)puVar51 + uVar59)) break;
      uVar59 = uVar59 + 1;
      uVar54 = uVar24;
    } while (uVar24 != uVar59);
    puVar53 = puVar53 + uVar54;
  }
  uVar24 = (long)puVar53 - (long)puVar25;
LAB_011074c9:
  if ((1 < uVar24) && (uVar59 = uVar24 * 0x87 + 0x78f, local_180 < uVar59)) {
    if (lVar48 != 0) {
      uVar59 = uVar59 - ((0x1ca10U >> ((byte)lVar48 & 0xe) & 0xe) + 0x27);
    }
    if (local_180 < uVar59) {
      local_168 = uVar43;
      local_198 = uVar24;
      local_190 = uVar24;
      local_180 = uVar59;
    }
  }
LAB_0110751b:
  lVar48 = lVar48 + 1;
  if (lVar48 == 0x10) goto code_r0x0110752c;
  goto LAB_011073ff;
code_r0x0110752c:
  uVar24 = (ulong)uVar38;
  uVar46 = uVar38 & 0x1ff;
  sVar33 = (hasher->privat)._H42.max_hops;
  uVar43 = uVar44 - *(uint *)((long)pvVar9 + uVar24 * 4);
  if (sVar33 != 0) {
    uVar42 = *(ushort *)((long)pvVar9 + uVar24 * 2 + 0x20000);
    uVar54 = 0;
    uVar59 = uVar43;
LAB_01107587:
    uVar54 = uVar59 + uVar54;
    if (uVar54 <= uVar39) {
      if (uVar18 + local_190 <= ringbuffer_mask) {
        uVar49 = uVar44 - uVar54 & ringbuffer_mask;
        uVar59 = uVar49 + local_190;
        if ((ringbuffer_mask < uVar59) || (ringbuffer[uVar18 + local_190] != ringbuffer[uVar59]))
        goto LAB_01107662;
        puVar25 = ringbuffer + uVar49;
        puVar51 = puVar3;
        uVar59 = local_178;
        puVar53 = puVar25;
        if (7 < local_178) {
          lVar48 = 0;
          lVar32 = 0;
LAB_011075f5:
          if (*(ulong *)((long)puVar3 + lVar48) == *(ulong *)(puVar25 + lVar48))
          goto code_r0x01107603;
          uVar49 = *(ulong *)(puVar25 + lVar48) ^ *(ulong *)((long)puVar3 + lVar48);
          uVar59 = 0;
          if (uVar49 != 0) {
            for (; (uVar49 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
            }
          }
          uVar59 = (uVar59 >> 3 & 0x1fffffff) - lVar32;
          goto LAB_01107691;
        }
        goto LAB_0110762f;
      }
      goto LAB_01107662;
    }
  }
LAB_011076d4:
  uVar42 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar46 * 2);
  *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar46 * 2) = uVar42 + 1;
  uVar23 = uVar42 & 0x1ff;
  *(char *)((long)pvVar9 + (uVar44 & 0xffff) + 0x30000) = (char)uVar38;
  if (0xfffe < uVar43) {
    uVar43 = 0xffff;
  }
  *(short *)((long)pvVar10 + (ulong)uVar23 * 4 + (ulong)(uVar46 << 0xb)) = (short)uVar43;
  *(undefined2 *)((long)pvVar10 + (ulong)uVar23 * 4 + (ulong)(uVar46 << 0xb) + 2) =
       *(undefined2 *)((long)pvVar9 + uVar24 * 2 + 0x20000);
  *(int *)((long)pvVar9 + uVar24 * 4) = (int)uVar44;
  *(short *)((long)pvVar9 + uVar24 * 2 + 0x20000) = (short)uVar23;
  local_190 = local_198;
  if (local_180 == 0x7e4) {
    pHVar11 = (hasher->privat)._H42.common;
    uVar39 = pHVar11->dict_num_lookups;
    local_138 = pHVar11->dict_num_matches;
    local_180 = 0x7e4;
    if (uVar39 >> 7 <= local_138) {
      uVar24 = (ulong)((uint)((int)*puVar3 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      puVar53 = pBVar8->hash_table_lengths;
      iVar30 = 0;
      local_180 = 0x7e4;
      bVar60 = true;
LAB_01107c92:
      uVar39 = uVar39 + 1;
      pHVar11->dict_num_lookups = uVar39;
      bVar22 = puVar53[uVar24];
      uVar43 = (ulong)bVar22;
      if ((uVar43 != 0) && (uVar43 <= local_178)) {
        pBVar14 = pBVar8->words;
        puVar26 = (ulong *)(pBVar14->data +
                           (ulong)pBVar14->offsets_by_length[uVar43] +
                           pBVar8->hash_table_words[uVar24] * uVar43);
        uVar59 = uVar43;
        puVar51 = puVar3;
        if (7 < bVar22) {
          lVar48 = 0;
LAB_01107d06:
          if (*puVar26 == *puVar51) goto code_r0x01107d11;
          uVar54 = *puVar51 ^ *puVar26;
          uVar59 = 0;
          if (uVar54 != 0) {
            for (; (uVar54 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
            }
          }
          uVar59 = (uVar59 >> 3 & 0x1fffffff) - lVar48;
          goto LAB_01107d74;
        }
        goto LAB_01107d38;
      }
      goto LAB_01107cb5;
    }
    iVar30 = 0;
  }
  else {
    iVar30 = 0;
  }
LAB_011077b6:
  local_160 = (params->dist).max_distance;
  sVar33 = (params->dictionary).compound.num_chunks;
  if (sVar33 != 0) {
    sVar57 = (params->dictionary).compound.total_size;
    sVar20 = 0;
LAB_0110780a:
    pPVar12 = (params->dictionary).compound.chunks[sVar20];
    bVar22 = (byte)pPVar12->bucket_bits;
    bVar41 = (byte)pPVar12->slot_bits;
    bVar16 = -(char)pPVar12->hash_bits;
    uVar39 = ((*puVar3 << (bVar16 & 0x3f)) >> (bVar16 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
             (-bVar22 & 0x3f);
    lVar48 = (1L << (bVar41 & 0x3f)) * 4;
    lVar32 = (1L << (bVar22 & 0x3f)) * 2;
    bVar41 = -bVar41;
    puVar45 = (undefined8 *)
              ((long)&pPVar12[1].magic + (ulong)pPVar12->num_items * 4 + lVar32 + lVar48);
    if (pPVar12->magic != 0xdebcede0) {
      puVar45 = (undefined8 *)*puVar45;
    }
    sVar13 = (params->dictionary).compound.chunk_offsets[sVar20];
    uVar24 = (local_c0 + sVar57) - sVar13;
    uVar43 = (ulong)pPVar12->source_size;
    uVar42 = *(ushort *)((long)&pPVar12[1].magic + (uVar39 & 0xffffffff) * 2 + lVar48);
    puVar19 = (uint *)((long)&pPVar12[1].magic +
                      (ulong)((uint)uVar42 +
                             (&pPVar12[1].magic)
                             [(uint)((int)uVar39 << (bVar41 & 0x1f)) >> (bVar41 & 0x1f)]) * 4 +
                      lVar32 + lVar48);
    lVar48 = 0;
    uVar39 = local_190;
LAB_011078e5:
    uVar59 = (ulong)dist_cache[lVar48];
    if ((uVar24 - uVar43 < uVar59) && (uVar59 <= uVar24)) {
      uVar54 = uVar43 - (uVar24 - uVar59);
      if (local_178 <= uVar54) {
        uVar54 = local_178;
      }
      lVar50 = (uVar24 - uVar59) + (long)puVar45;
      lVar32 = lVar50;
      puVar51 = puVar3;
      if (7 < uVar54) {
        lVar32 = ((uVar21 + sVar57) - sVar13) - uVar59;
        lVar52 = 0;
LAB_01107925:
        uVar49 = *(ulong *)((long)puVar45 + lVar52 + lVar32);
        if (*(ulong *)((long)puVar3 + lVar52) == uVar49) goto code_r0x01107934;
        uVar49 = uVar49 ^ *(ulong *)((long)puVar3 + lVar52);
        uVar54 = 0;
        if (uVar49 != 0) {
          for (; (uVar49 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
          }
        }
        uVar54 = (uVar54 >> 3 & 0x1fffffff) + lVar52;
        goto LAB_0110798e;
      }
      goto LAB_01107950;
    }
    goto LAB_011079f6;
  }
LAB_01107bb9:
  uVar21 = local_170 + 0xaf;
  local_170 = local_180;
  if (local_180 < uVar21) {
    local_190 = local_e8;
    uVar44 = uVar27;
    iVar30 = local_144;
    sVar33 = local_158;
    local_c0 = sVar6 + uVar27;
    if (uVar36 <= sVar6 + uVar27) {
      local_c0 = uVar36;
    }
    goto LAB_011081bc;
  }
  local_f0 = local_168;
  sVar33 = uVar31;
  if (local_d4 == 3) goto LAB_011081bc;
  local_158 = local_158 + 1;
  local_d4 = local_d4 + 1;
  uVar21 = uVar27 + 5;
  local_128 = local_128 - 1;
  uVar55 = uVar55 + 1;
  uVar27 = uVar44;
  local_e8 = local_190;
  sVar33 = local_158;
  local_144 = iVar30;
  if (uVar2 <= uVar21) goto LAB_011081bc;
  goto LAB_011072de;
code_r0x01107603:
  lVar48 = lVar48 + 8;
  lVar50 = local_128 + lVar32;
  lVar32 = lVar32 + -8;
  if (lVar50 - 8U < 8) goto code_r0x0110761e;
  goto LAB_011075f5;
code_r0x0110761e:
  puVar53 = puVar25 + -lVar32;
  puVar51 = (ulong *)((long)puVar3 - lVar32);
  uVar59 = lVar32 + local_128;
LAB_0110762f:
  puVar58 = puVar53;
  if (uVar59 != 0) {
    puVar58 = puVar53 + uVar59;
    uVar49 = 0;
    do {
      if (puVar53[uVar49] != *(uint8_t *)((long)puVar51 + uVar49)) {
        puVar58 = puVar53 + uVar49;
        break;
      }
      uVar49 = uVar49 + 1;
    } while (uVar59 != uVar49);
  }
  uVar59 = (long)puVar58 - (long)puVar25;
LAB_01107691:
  if (3 < uVar59) {
    iVar30 = 0x1f;
    if ((uint)uVar54 != 0) {
      for (; (uint)uVar54 >> iVar30 == 0; iVar30 = iVar30 + -1) {
      }
    }
    uVar49 = (ulong)(iVar30 * -0x1e + 0x780) + uVar59 * 0x87;
    if (local_180 < uVar49) {
      local_190 = uVar59;
      local_198 = uVar59;
      local_180 = uVar49;
      local_168 = uVar54;
    }
  }
LAB_01107662:
  uVar59 = (ulong)uVar42;
  uVar42 = *(ushort *)((long)pvVar10 + uVar59 * 4 + (ulong)(uVar46 << 0xb) + 2);
  uVar59 = (ulong)*(ushort *)((long)pvVar10 + uVar59 * 4 + (ulong)(uVar46 << 0xb));
  sVar33 = sVar33 - 1;
  if (sVar33 == 0) goto LAB_011076d4;
  goto LAB_01107587;
code_r0x01107d11:
  puVar26 = puVar26 + 1;
  puVar51 = puVar51 + 1;
  lVar32 = uVar43 + lVar48;
  lVar48 = lVar48 + -8;
  if (lVar32 - 8U < 8) goto code_r0x01107d2b;
  goto LAB_01107d06;
code_r0x01107d2b:
  uVar59 = lVar48 + uVar43;
  if (lVar48 + uVar43 != 0) {
LAB_01107d38:
    uVar54 = 0;
    do {
      uVar49 = uVar54;
      if (*(char *)((long)puVar51 + uVar54) != *(char *)((long)puVar26 + uVar54)) break;
      uVar54 = uVar54 + 1;
      uVar49 = uVar59;
    } while (uVar59 != uVar54);
    puVar51 = (ulong *)((long)puVar51 + uVar49);
  }
  uVar59 = (long)puVar51 - (long)puVar3;
LAB_01107d74:
  if (((uVar59 != 0) && (uVar43 < pBVar8->cutoffTransformsCount + uVar59)) &&
     (uVar43 = (ulong)pBVar8->hash_table_words[uVar24] + lVar1 + local_c0 +
               ((ulong)((uint)(pBVar8->cutoffTransforms >>
                              ((char)(uVar43 - uVar59) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar43 - uVar59) * 4 << (pBVar14->size_bits_by_length[uVar43] & 0x3f)),
     uVar43 <= local_160)) {
    iVar61 = 0x1f;
    if ((uint)uVar43 != 0) {
      for (; (uint)uVar43 >> iVar61 == 0; iVar61 = iVar61 + -1) {
      }
    }
    uVar54 = (uVar59 * 0x87 - (ulong)(uint)(iVar61 * 0x1e)) + 0x780;
    if (local_180 <= uVar54) {
      iVar30 = (uint)bVar22 - (int)uVar59;
      local_138 = local_138 + 1;
      pHVar11->dict_num_matches = local_138;
      local_168 = uVar43;
      local_180 = uVar54;
      local_198 = uVar59;
    }
  }
LAB_01107cb5:
  uVar24 = uVar24 + 1;
  bVar17 = !bVar60;
  local_190 = local_198;
  bVar60 = false;
  if (bVar17) goto LAB_011077b6;
  goto LAB_01107c92;
code_r0x01107934:
  uVar54 = uVar54 - 8;
  lVar52 = lVar52 + 8;
  if (uVar54 < 8) goto code_r0x01107942;
  goto LAB_01107925;
code_r0x01107942:
  lVar32 = (long)puVar45 + lVar52 + lVar32;
  puVar51 = (ulong *)(lVar52 + (long)puVar3);
LAB_01107950:
  if (uVar54 != 0) {
    uVar49 = 0;
    do {
      uVar34 = uVar49;
      if (*(char *)(lVar32 + uVar49) != *(char *)((long)puVar51 + uVar49)) break;
      uVar49 = uVar49 + 1;
      uVar34 = uVar54;
    } while (uVar54 != uVar49);
    lVar32 = uVar34 + lVar32;
  }
  uVar54 = lVar32 - lVar50;
LAB_0110798e:
  if ((1 < uVar54) && (uVar49 = uVar54 * 0x87 + 0x78f, local_180 < uVar49)) {
    if (lVar48 != 0) {
      uVar49 = uVar49 - ((0x1ca10U >> ((byte)lVar48 & 2) & 4) + 0x27);
    }
    if (local_180 < uVar49) {
      if (uVar39 < uVar54) {
        uVar39 = uVar54;
      }
      iVar30 = 0;
      local_190 = uVar54;
      local_180 = uVar49;
      local_168 = uVar59;
    }
  }
LAB_011079f6:
  lVar48 = lVar48 + 1;
  if (lVar48 == 4) goto code_r0x01107a03;
  goto LAB_011078e5;
code_r0x01107a03:
  if (uVar42 != 0xffff) {
LAB_01107a14:
    uVar38 = *puVar19;
    uVar34 = (ulong)(uVar38 & 0x7fffffff);
    uVar49 = uVar24 - uVar34;
    uVar59 = uVar43 - uVar34;
    uVar54 = local_178;
    if (uVar59 < local_178) {
      uVar54 = uVar59;
    }
    if ((((uVar49 <= local_160) && (uVar18 + uVar39 <= ringbuffer_mask)) && (uVar39 < uVar54)) &&
       (ringbuffer[uVar18 + uVar39] == *(uint8_t *)((long)puVar45 + uVar39 + uVar34))) {
      puVar35 = (ulong *)(uVar34 + (long)puVar45);
      puVar51 = puVar35;
      puVar26 = puVar3;
      if (7 < uVar54) {
        uVar54 = uVar59;
        if (local_128 < uVar59) {
          uVar54 = local_128;
        }
        lVar48 = 0;
        puVar40 = puVar35;
LAB_01107ab0:
        if (*puVar26 == *puVar40) goto code_r0x01107abb;
        uVar54 = *puVar40 ^ *puVar26;
        uVar59 = 0;
        if (uVar54 != 0) {
          for (; (uVar54 >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
          }
        }
        uVar59 = (uVar59 >> 3 & 0x1fffffff) - lVar48;
        goto LAB_01107b3c;
      }
      goto LAB_01107af1;
    }
    goto LAB_01107a3d;
  }
LAB_01107b8f:
  sVar20 = sVar20 + 1;
  if (sVar20 == sVar33) goto LAB_01107bb9;
  goto LAB_0110780a;
code_r0x01107abb:
  puVar26 = puVar26 + 1;
  puVar40 = puVar40 + 1;
  lVar32 = lVar48 + uVar54;
  lVar48 = lVar48 + -8;
  if (lVar32 - 8U < 8) goto code_r0x01107ad5;
  goto LAB_01107ab0;
code_r0x01107ad5:
  if (local_128 < uVar59) {
    uVar59 = local_128;
  }
  uVar54 = uVar59 + lVar48;
  puVar51 = puVar40;
  if (uVar54 != 0) {
LAB_01107af1:
    puVar40 = (ulong *)((long)puVar51 + uVar54);
    uVar59 = 0;
    do {
      if (*(char *)((long)puVar51 + uVar59) != *(char *)((long)puVar26 + uVar59)) {
        puVar40 = (ulong *)((long)puVar51 + uVar59);
        break;
      }
      uVar59 = uVar59 + 1;
    } while (uVar54 != uVar59);
  }
  uVar59 = (long)puVar40 - (long)puVar35;
LAB_01107b3c:
  if (3 < uVar59) {
    iVar61 = 0x1f;
    if ((uint)uVar49 != 0) {
      for (; (uint)uVar49 >> iVar61 == 0; iVar61 = iVar61 + -1) {
      }
    }
    uVar54 = (ulong)(iVar61 * -0x1e + 0x780) + uVar59 * 0x87;
    if (local_180 < uVar54) {
      iVar30 = 0;
      uVar39 = uVar59;
      local_190 = uVar59;
      local_180 = uVar54;
      local_168 = uVar49;
    }
  }
LAB_01107a3d:
  puVar19 = puVar19 + 1;
  if ((int)uVar38 < 0) goto LAB_01107b8f;
  goto LAB_01107a14;
LAB_011081bc:
  local_158 = sVar33;
  local_c0 = local_c0 + sVar7;
  if (local_c0 < local_f0) {
LAB_011081da:
    uVar55 = local_f0 + 0xf;
LAB_011081de:
    if ((local_f0 <= local_c0) && (uVar55 != 0)) {
      dist_cache[3] = dist_cache[2];
      uVar15 = *(undefined8 *)dist_cache;
      *(undefined8 *)(dist_cache + 1) = uVar15;
      iVar61 = (int)local_f0;
      *dist_cache = iVar61;
      dist_cache[4] = iVar61 + -1;
      dist_cache[5] = iVar61 + 1;
      dist_cache[6] = iVar61 + -2;
      dist_cache[7] = iVar61 + 2;
      dist_cache[8] = iVar61 + -3;
      dist_cache[9] = iVar61 + 3;
      iVar61 = (int)uVar15;
      dist_cache[10] = iVar61 + -1;
      dist_cache[0xb] = iVar61 + 1;
      dist_cache[0xc] = iVar61 + -2;
      dist_cache[0xd] = iVar61 + 2;
      *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar61 + 3,iVar61 + -3);
    }
  }
  else {
    if (local_f0 != (long)*dist_cache) {
      uVar55 = 1;
      if (local_f0 != (long)dist_cache[1]) {
        uVar55 = (local_f0 + 3) - (long)*dist_cache;
        if (uVar55 < 7) {
          bVar22 = (byte)((int)uVar55 << 2);
          uVar38 = 0x9750468;
        }
        else {
          uVar55 = (local_f0 + 3) - (long)dist_cache[1];
          if (6 < uVar55) {
            uVar55 = 2;
            if ((local_f0 != (long)dist_cache[2]) && (uVar55 = 3, local_f0 != (long)dist_cache[3]))
            goto LAB_011081da;
            goto LAB_011081de;
          }
          bVar22 = (byte)((int)uVar55 << 2);
          uVar38 = 0xfdb1ace;
        }
        uVar55 = (ulong)(uVar38 >> (bVar22 & 0x1f) & 0xf);
      }
      goto LAB_011081de;
    }
    uVar55 = 0;
  }
  uVar38 = (uint)local_158;
  local_f8->insert_len_ = uVar38;
  local_f8->copy_len_ = iVar30 << 0x19 | (uint)local_190;
  uVar31 = (ulong)(params->dist).num_direct_distance_codes;
  uVar27 = uVar31 + 0x10;
  uVar28 = 0;
  if (uVar27 <= uVar55) {
    uVar46 = (params->dist).distance_postfix_bits;
    bVar22 = (byte)uVar46;
    uVar31 = ((4L << (bVar22 & 0x3f)) + (uVar55 - uVar31)) - 0x10;
    uVar23 = 0x1f;
    uVar29 = (uint)uVar31;
    if (uVar29 != 0) {
      for (; uVar29 >> uVar23 == 0; uVar23 = uVar23 - 1) {
      }
    }
    uVar23 = (uVar23 ^ 0xffffffe0) + 0x1f;
    uVar21 = (ulong)((uVar31 >> ((ulong)uVar23 & 0x3f) & 1) != 0);
    lVar48 = (ulong)uVar23 - (ulong)uVar46;
    uVar55 = (~(-1 << (bVar22 & 0x1f)) & uVar29) + uVar27 +
             (uVar21 + lVar48 * 2 + 0xfffe << (bVar22 & 0x3f)) | lVar48 * 0x400;
    uVar28 = (uint32_t)(uVar31 - (uVar21 + 2 << ((byte)uVar23 & 0x3f)) >> (bVar22 & 0x3f));
  }
  local_f8->dist_prefix_ = (uint16_t)uVar55;
  local_f8->dist_extra_ = uVar28;
  if (5 < local_158) {
    if (local_158 < 0x82) {
      uVar38 = 0x1f;
      uVar46 = (uint)(local_158 - 2);
      if (uVar46 != 0) {
        for (; uVar46 >> uVar38 == 0; uVar38 = uVar38 - 1) {
        }
      }
      uVar38 = (int)(local_158 - 2 >> ((char)(uVar38 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar38 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_158 < 0x842) {
      uVar46 = 0x1f;
      if (uVar38 - 0x42 != 0) {
        for (; uVar38 - 0x42 >> uVar46 == 0; uVar46 = uVar46 - 1) {
        }
      }
      uVar38 = (uVar46 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar38 = 0x15;
      if (0x1841 < local_158) {
        uVar38 = (uint)(ushort)(0x17 - (local_158 < 0x5842));
      }
    }
  }
  uVar46 = iVar30 + (uint)local_190;
  if (uVar46 < 10) {
    uVar23 = uVar46 - 2;
  }
  else if (uVar46 < 0x86) {
    uVar46 = uVar46 - 6;
    uVar23 = 0x1f;
    if (uVar46 != 0) {
      for (; uVar46 >> uVar23 == 0; uVar23 = uVar23 - 1) {
      }
    }
    uVar23 = (uVar46 >> ((char)(uVar23 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar23 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar23 = 0x17;
    if (uVar46 < 0x846) {
      uVar23 = 0x1f;
      if (uVar46 - 0x46 != 0) {
        for (; uVar46 - 0x46 >> uVar23 == 0; uVar23 = uVar23 - 1) {
        }
      }
      uVar23 = (uVar23 ^ 0xffe0) + 0x2c;
    }
  }
  uVar42 = (ushort)uVar23;
  uVar37 = (uVar42 & 7) + ((ushort)uVar38 & 7) * 8;
  if ((((uVar55 & 0x3ff) == 0) && ((ushort)uVar38 < 8)) && (uVar42 < 0x10)) {
    if (7 < uVar42) {
      uVar37 = uVar37 + 0x40;
    }
  }
  else {
    iVar30 = ((uVar38 & 0xffff) >> 3) * 3 + ((uVar23 & 0xffff) >> 3);
    uVar37 = uVar37 + ((ushort)(0x520d40 >> ((char)iVar30 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar30 * 0x40 + 0x40;
  }
  local_f8->cmd_prefix_ = uVar37;
  *num_literals = *num_literals + local_158;
  position = local_190 + uVar44;
  uVar27 = sVar47;
  if (position < sVar47) {
    uVar27 = position;
  }
  uVar31 = uVar44 + 2;
  if (local_f0 < local_190 >> 2) {
    uVar55 = position + local_f0 * -4;
    if (uVar55 < uVar31) {
      uVar55 = uVar31;
    }
    uVar31 = uVar55;
    if (uVar27 < uVar55) {
      uVar31 = uVar27;
    }
  }
  uVar55 = uVar44 + lVar56 + local_190 * 2;
  local_f8 = local_f8 + 1;
  if (uVar31 < uVar27) {
    pvVar9 = (hasher->privat)._H42.extra[0];
    pvVar10 = (hasher->privat)._H42.extra[1];
    do {
      uVar38 = (uint)(*(int *)(ringbuffer + (uVar31 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
      uVar44 = (ulong)uVar38;
      uVar23 = uVar38 & 0x1ff;
      uVar42 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar23 * 2);
      *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar23 * 2) = uVar42 + 1;
      uVar46 = uVar42 & 0x1ff;
      uVar21 = uVar31 - *(uint *)((long)pvVar9 + uVar44 * 4);
      *(char *)((long)pvVar9 + (uVar31 & 0xffff) + 0x30000) = (char)uVar38;
      if (0xfffe < uVar21) {
        uVar21 = 0xffff;
      }
      *(short *)((long)pvVar10 + (ulong)uVar46 * 4 + (ulong)(uVar23 << 0xb)) = (short)uVar21;
      *(undefined2 *)((long)pvVar10 + (ulong)uVar46 * 4 + (ulong)(uVar23 << 0xb) + 2) =
           *(undefined2 *)((long)pvVar9 + uVar44 * 2 + 0x20000);
      *(int *)((long)pvVar9 + uVar44 * 4) = (int)uVar31;
      *(short *)((long)pvVar9 + uVar44 * 2 + 0x20000) = (short)uVar46;
      uVar31 = uVar31 + 1;
    } while (uVar27 != uVar31);
    local_158 = 0;
  }
  else {
    local_158 = 0;
  }
LAB_0110869f:
  uVar27 = position;
  if (uVar2 <= position + 4) goto LAB_01108705;
  goto LAB_01106a31;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}